

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Seanet.h
# Opt level: O3

int GetMsgSeanet(SEANET *pSeanet,int mid,uchar *databuf,int databuflen,int *pNbdatabytes)

{
  uchar *__dest;
  int iVar1;
  int iVar2;
  ssize_t sVar3;
  long lVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  char *__s;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  int len;
  int remainingdatalen;
  uchar *ptr;
  uchar *remainingdata;
  CHRONO chrono;
  uchar recvbuf [2048];
  uint local_8c4;
  int local_8c0;
  int local_8bc;
  uint local_8b8;
  int local_8b4;
  uchar *local_8b0;
  timespec local_8a8;
  uint *local_898;
  uchar *local_890;
  uchar *local_888;
  timespec local_880;
  undefined8 local_870;
  undefined8 uStack_868;
  long local_860;
  long lStack_858;
  timespec local_850;
  int local_840;
  uchar local_838;
  undefined4 local_837;
  ushort auStack_833 [2];
  uchar auStack_82e [2046];
  
  local_8b0 = (uchar *)0x0;
  local_8c4 = 0;
  local_888 = (uchar *)0x0;
  local_8bc = 0;
  local_8c0 = mid;
  iVar1 = clock_getres(4,&local_850);
  if ((iVar1 == 0) && (iVar1 = clock_gettime(4,&local_880), iVar1 == 0)) {
    local_840 = 0;
    local_870 = 0;
    uStack_868 = 0;
    local_860 = 0;
    lStack_858 = 0;
  }
  uVar9 = 0;
  memset(&local_838,0,0x800);
  iVar1 = (pSeanet->RS232Port).DevType;
  if (iVar1 - 1U < 4) {
    iVar1 = (pSeanet->RS232Port).s;
    do {
      sVar3 = recv(iVar1,&local_838 + uVar9,(ulong)(0xb - (int)uVar9),0);
      if ((int)sVar3 < 1) goto LAB_001a2aa1;
      uVar6 = (int)uVar9 + (int)sVar3;
      uVar9 = (ulong)uVar6;
    } while ((int)uVar6 < 0xb);
LAB_001a27d4:
    uVar9 = 0xb;
    lVar5 = 0;
    local_8b4 = databuflen;
    local_898 = (uint *)pNbdatabytes;
    local_890 = databuf;
    do {
      if ((&local_838)[lVar5] == '@') {
        local_8b8 = 0;
        local_8a8.tv_sec._4_4_ = local_8a8.tv_sec._4_4_ & 0xffffff00;
        local_8a8.tv_sec._0_4_ = *(undefined4 *)((long)auStack_833 + lVar5 + -4);
        iVar1 = __isoc99_sscanf(&local_8a8,"%x",&local_8b8);
        uVar6 = 0;
        if (iVar1 == 1) {
          uVar6 = local_8b8;
        }
        if ((uVar6 == *(ushort *)((long)auStack_833 + lVar5)) &&
           (auStack_82e[lVar5] == (uchar)local_8c0)) {
          local_8c4 = uVar6 + 6;
          uVar7 = uVar6 + (int)lVar5 + 6;
          if (0x7ff < (int)uVar7) goto LAB_001a2a8e;
          if (uVar6 < 6) goto LAB_001a2a5e;
          uVar6 = uVar6 - 5;
          iVar1 = (pSeanet->RS232Port).DevType;
          if (iVar1 - 1U < 4) {
            iVar1 = (pSeanet->RS232Port).s;
            uVar12 = 0;
            goto LAB_001a2a0b;
          }
          if (iVar1 == 0) {
            iVar1 = *(int *)&(pSeanet->RS232Port).hDev;
            uVar12 = 0;
            goto LAB_001a2a3c;
          }
          goto LAB_001a2aa1;
        }
      }
      lVar8 = local_860;
      lVar4 = lStack_858;
      if (local_840 == 0) {
        clock_gettime(4,&local_8a8);
        lVar8 = ((CONCAT44(local_8a8.tv_sec._4_4_,(undefined4)local_8a8.tv_sec) + local_860) -
                local_880.tv_sec) + (local_8a8.tv_nsec + lStack_858) / 1000000000;
        lVar4 = (local_8a8.tv_nsec + lStack_858) % 1000000000 - local_880.tv_nsec;
        if (lVar4 < 0) {
          lVar8 = lVar8 + ~((ulong)-lVar4 / 1000000000);
          lVar4 = lVar4 + 1000000000 + ((ulong)-lVar4 / 1000000000) * 1000000000;
        }
      }
      if (4.0 < (double)lVar4 / 1000000000.0 + (double)lVar8) {
        puts("Error reading data from a Seanet : Message timeout. ");
        return 2;
      }
      if (lVar5 == 0x7f4) goto LAB_001a2a8e;
      iVar1 = (pSeanet->RS232Port).DevType;
      if (iVar1 - 1U < 4) {
        iVar1 = (pSeanet->RS232Port).s;
        uVar12 = 0;
        do {
          iVar10 = (int)uVar12;
          sVar3 = recv(iVar1,&local_838 + uVar9 + uVar12,(ulong)(1 - iVar10),0);
          iVar2 = (int)sVar3;
          if (iVar2 < 1) goto LAB_001a2aa1;
          uVar6 = iVar10 + iVar2;
          uVar12 = (ulong)uVar6;
        } while (uVar6 == 0 || SCARRY4(iVar10,iVar2) != (int)uVar6 < 0);
      }
      else if ((iVar1 != 0) ||
              (sVar3 = read(*(int *)&(pSeanet->RS232Port).hDev,&local_838 + uVar9,1), (int)sVar3 < 1
              )) goto LAB_001a2aa1;
      uVar9 = uVar9 + 1;
      lVar5 = lVar5 + 1;
    } while( true );
  }
  if (iVar1 == 0) {
    iVar1 = *(int *)&(pSeanet->RS232Port).hDev;
    uVar9 = 0;
    do {
      sVar3 = read(iVar1,&local_838 + uVar9,(ulong)(0xb - (int)uVar9));
      if ((int)sVar3 < 1) goto LAB_001a2aa1;
      uVar6 = (int)uVar9 + (int)sVar3;
      uVar9 = (ulong)uVar6;
    } while (uVar6 < 0xb);
    goto LAB_001a27d4;
  }
LAB_001a2aa1:
  __s = "Error reading data from a Seanet. ";
  goto LAB_001a2aa8;
  while (uVar11 = (int)uVar12 + (int)sVar3, uVar12 = (ulong)uVar11, (int)uVar11 < (int)uVar6) {
LAB_001a2a0b:
    sVar3 = recv(iVar1,&local_838 + uVar12 + (uVar9 & 0xffffffff),(long)(int)(uVar6 - (int)uVar12),0
                );
    if ((int)sVar3 < 1) goto LAB_001a2aa1;
  }
  goto LAB_001a2a5b;
  while (uVar11 = (int)uVar12 + (int)sVar3, uVar12 = (ulong)uVar11, uVar11 < uVar6) {
LAB_001a2a3c:
    sVar3 = read(iVar1,&local_838 + uVar12 + (uVar9 & 0xffffffff),(ulong)(uVar6 - (int)uVar12));
    if ((int)sVar3 < 1) goto LAB_001a2aa1;
  }
LAB_001a2a5b:
  uVar9 = (ulong)uVar7;
LAB_001a2a5e:
  iVar1 = FindLatestMsgWithMIDSeanet
                    (&local_838,(int)uVar9,local_8c0,&local_8b0,(int *)&local_8c4,&local_888,
                     &local_8bc);
  if (iVar1 == 0) {
    if (0 < local_8bc) {
      puts("Error getting data from a Seanet : Unexpected data after a message. ");
    }
    __dest = local_890;
    iVar1 = local_8b4;
    memset(local_890,0,(long)local_8b4);
    *local_898 = local_8c4;
    if (iVar1 < (int)local_8c4) {
      __s = "Error getting data from a Seanet : Too small data buffer. ";
LAB_001a2aa8:
      puts(__s);
      iVar1 = 1;
    }
    else {
      iVar1 = 0;
      if (0 < (int)local_8c4) {
        memcpy(__dest,local_8b0,(ulong)local_8c4);
        iVar1 = 0;
      }
    }
  }
  else {
LAB_001a2a8e:
    puts("Error reading data from a Seanet : Invalid data. ");
    iVar1 = 4;
  }
  return iVar1;
}

Assistant:

inline int GetMsgSeanet(SEANET* pSeanet, int mid, unsigned char* databuf, int databuflen, int* pNbdatabytes)
{
	unsigned char recvbuf[MAX_NB_BYTES_SEANET];
	int i = 0;
	int BytesReceived = 0, recvbuflen = 0;
	unsigned char* ptr = NULL;
	int len = 0;
	unsigned char* remainingdata = NULL;
	int remainingdatalen = 0;
	CHRONO chrono;

	StartChrono(&chrono);

	// Prepare the buffers.
	memset(recvbuf, 0, sizeof(recvbuf));
	recvbuflen = MAX_NB_BYTES_SEANET-1; // The last character must be a 0 to be a valid string for sscanf.
	BytesReceived = 0;

	// Suppose that there are not so many data to discard.
	// First try to get directly the desired message...

	if (ReadAllRS232Port(&pSeanet->RS232Port, recvbuf, MIN_MESSAGE_LEN_SEANET) != EXIT_SUCCESS)
	{
		printf("Error reading data from a Seanet. \n");
		return EXIT_FAILURE;
	}
	BytesReceived += MIN_MESSAGE_LEN_SEANET;

	i = 0;
	while (AnalyseBufHdrHexBinLenMIDSeanet(recvbuf+i, BytesReceived-i, mid, &len) != EXIT_SUCCESS)
	{
		if (GetTimeElapsedChronoQuick(&chrono) > TIMEOUT_MESSAGE_SEANET)
		{
			printf("Error reading data from a Seanet : Message timeout. \n");
			return EXIT_TIMEOUT;
		}
		if (BytesReceived+1 > recvbuflen)
		{
			printf("Error reading data from a Seanet : Invalid data. \n");
			return EXIT_INVALID_DATA;
		}
		if (ReadAllRS232Port(&pSeanet->RS232Port, recvbuf+BytesReceived, 1) != EXIT_SUCCESS)
		{
			printf("Error reading data from a Seanet. \n");
			return EXIT_FAILURE;
		}
		BytesReceived += 1;
		i++;
	}

	// Notes :
	// BytesReceived+len-(BytesReceived-i) = len+i
	// BytesReceived = MIN_MESSAGE_LEN_SEANET+i
	// len-MIN_MESSAGE_LEN_SEANET = len-(BytesReceived-i)
	if (len+i > recvbuflen)
	{
		printf("Error reading data from a Seanet : Invalid data. \n");
		return EXIT_INVALID_DATA;
	}

	// Read the remaining bytes of the message according to the length found.
	if (len-(BytesReceived-i) > 0)
	{
		if (ReadAllRS232Port(&pSeanet->RS232Port, recvbuf+BytesReceived, len-(BytesReceived-i)) != EXIT_SUCCESS)
		{
			printf("Error reading data from a Seanet. \n");
			return EXIT_FAILURE;
		}
		BytesReceived += (len-(BytesReceived-i));
	}

	if (FindLatestMsgWithMIDSeanet(recvbuf, BytesReceived, mid, 
		&ptr, &len, &remainingdata, &remainingdatalen) != EXIT_SUCCESS)
	{
		printf("Error reading data from a Seanet : Invalid data. \n");
		return EXIT_INVALID_DATA;
	}

	if (remainingdatalen > 0)
	{
		printf("Error getting data from a Seanet : Unexpected data after a message. \n");
	}

	// Get data bytes.

	memset(databuf, 0, databuflen);
	*pNbdatabytes = len;

	// Check the number of data bytes before copy.
	if (databuflen < *pNbdatabytes)
	{
		printf("Error getting data from a Seanet : Too small data buffer. \n");
		return EXIT_FAILURE;
	}

	// Copy the data bytes of the message.
	if (*pNbdatabytes > 0)
	{
		memcpy(databuf, ptr, *pNbdatabytes);
	}

	return EXIT_SUCCESS;
}